

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

void __thiscall
mp::VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::apply_precision_options
          (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this,int sol_rnd,int sol_prec
          )

{
  bool bVar1;
  reference pdVar2;
  int in_EDX;
  int in_ESI;
  double in_RDI;
  double dVar3;
  double *x_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<double,_std::allocator<double>_> *__range4_1;
  double *x;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range4;
  double scale_rec;
  __type scale;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  long local_58;
  reference local_50;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  long local_38;
  double local_30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *local_18;
  int local_10;
  
  local_10 = in_EDX;
  if (in_ESI < 100) {
    *(int *)((long)in_RDI + 200) = in_ESI;
    in_stack_ffffffffffffff80 =
         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
         std::pow<int,int>(0,0x160b4e);
    local_30 = 1.0 / (double)in_stack_ffffffffffffff80;
    local_38 = (long)in_RDI + 0x10;
    local_18 = in_stack_ffffffffffffff80;
    local_40._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    local_48 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      local_50 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_40);
      dVar3 = round(*local_50 * (double)local_18);
      *local_50 = dVar3 * local_30;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_40);
    }
  }
  if (local_10 < 100) {
    *(int *)((long)in_RDI + 0xcc) = local_10;
    local_58 = (long)in_RDI + 0x10;
    local_60._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_60);
      in_stack_ffffffffffffff78 =
           (vector<double,_std::allocator<double>_> *)
           round_to_digits<double>(in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      *pdVar2 = (double)in_stack_ffffffffffffff78;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_60);
    }
  }
  return;
}

Assistant:

void apply_precision_options(
      int sol_rnd, int sol_prec) {
    try {                 // Apply sol_rnd
      if (sol_rnd<100) {
        sol_rnd_ = (sol_rnd);
        auto scale = std::pow(10, sol_rnd_);
        auto scale_rec = 1.0/scale;
        for (auto& x: x_)
          x = std::round(x * scale) * scale_rec;
      }
    } catch (...) { sol_rnd_=100; }     // Could add a warning
    try {                 // Apply sol_prec
      if (sol_prec<100) {
        sol_prec_ = (sol_prec);
        for (auto& x: x_)
          x = round_to_digits(x, sol_prec_);
      }
    } catch (...) { sol_prec_=100; }     // Could add a warning
  }